

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

optional<tinyusdz::crate::Field> * __thiscall
tinyusdz::crate::CrateReader::GetField
          (optional<tinyusdz::crate::Field> *__return_storage_ptr__,CrateReader *this,Index index)

{
  pointer pFVar1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar3 = (ulong)index.value;
  pFVar1 = (this->_fields).
           super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar2 = (ulong)((long)(this->_fields).
                        super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) <= uVar3;
  if (bVar2) {
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  }
  else {
    pFVar1 = pFVar1 + uVar3;
    uVar4 = (pFVar1->value_rep).data;
    *(undefined8 *)&__return_storage_ptr__->contained = *(undefined8 *)pFVar1;
    *(uint64_t *)((long)&__return_storage_ptr__->contained + 8) = uVar4;
  }
  __return_storage_ptr__->has_value_ = !bVar2;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<crate::Field> CrateReader::GetField(crate::Index index) const {

  if (index.value < _fields.size()) {
    return _fields[index.value];
  } else {
    return nonstd::nullopt;
  }
}